

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O1

void __thiscall
yactfr::internal::SetKeyDtsDtVisitor::_setKeyDtsVar<yactfr::VariantWithUnsignedIntegerSelectorType>
          (SetKeyDtsDtVisitor *this,VariantWithUnsignedIntegerSelectorType *dt,DataLocation *loc,
          const_iterator locIt,DataTypeSet *dts)

{
  ulong uVar1;
  pointer puVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
  *opt;
  pointer puVar7;
  
  uVar1 = (this->_current)._M_h._M_bucket_count;
  uVar4 = (ulong)dt % uVar1;
  p_Var5 = (this->_current)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5,
     (VariantWithUnsignedIntegerSelectorType *)p_Var5->_M_nxt[1]._M_nxt != dt)) {
    while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (VariantWithUnsignedIntegerSelectorType *)p_Var3[1]._M_nxt == dt))
      goto LAB_00242d22;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00242d22:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    puVar2 = (dt->super_VariantWithIntegerSelectorType<unsigned_long_long>)._opts.
             super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar7 = (dt->super_VariantWithIntegerSelectorType<unsigned_long_long>)._opts.
                  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1)
    {
      _setKeyDts(this,(DataType *)
                      (((puVar7->_M_t).
                        super___uniq_ptr_impl<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_yactfr::VariantTypeOption<unsigned_long_long>_*,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                        .
                        super__Head_base<0UL,_const_yactfr::VariantTypeOption<unsigned_long_long>_*,_false>
                       ._M_head_impl)->_dt)._M_t.
                      super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>
                 ,loc,locIt,dts);
    }
    return;
  }
  _setKeyDts(this,*(DataType **)
                   ((long)(dt->super_VariantWithIntegerSelectorType<unsigned_long_long>)._opts.
                          super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var3[2]._M_nxt]._M_t.
                          super___uniq_ptr_impl<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                          ._M_t + 0x50),loc,locIt,dts);
  return;
}

Assistant:

void _setKeyDtsVar(const VarTypeT& dt, const DataLocation& loc,
                       const DataLocation::PathElements::const_iterator locIt, DataTypeSet& dts) const
    {
        const auto it = _current.find(&dt);

        if (it == _current.end()) {
            // fan out (consider all options)
            for (auto& opt : dt.options()) {
                this->_setKeyDts(opt->dataType(), loc, locIt, dts);
            }
        } else {
            // follow current option only
            this->_setKeyDts(dt[it->second].dataType(), loc, locIt, dts);
        }
    }